

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O1

bool __thiscall
MeCab::RewritePattern::rewrite(RewritePattern *this,size_t size,char **input,string *output)

{
  char cVar1;
  char *__s2;
  char *pcVar2;
  RewritePattern *pRVar3;
  byte bVar4;
  int iVar5;
  pointer pbVar6;
  size_t sVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  char *pcVar11;
  byte *pbVar12;
  ulong uVar13;
  byte *pbVar14;
  byte *pbVar15;
  char *pcVar16;
  long lVar17;
  char *__s;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  string elm;
  die local_8a;
  die local_89;
  char *local_88;
  RewritePattern *local_80;
  string local_78;
  string *local_58;
  ulong local_50;
  char **local_48;
  size_t local_40;
  size_t local_38;
  
  if (size < (ulong)((long)(this->spat_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->spat_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5)) {
LAB_0013be74:
    bVar20 = false;
  }
  else {
    pbVar6 = (this->spat_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar20 = (this->spat_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish != pbVar6;
    local_80 = this;
    local_58 = output;
    local_48 = input;
    local_38 = size;
    if (bVar20) {
      uVar13 = 0;
      do {
        local_50 = CONCAT71(local_50._1_7_,bVar20);
        pcVar11 = pbVar6[uVar13]._M_dataplus._M_p;
        cVar1 = *pcVar11;
        if (cVar1 != '*') {
          __s2 = local_48[uVar13];
          iVar5 = strcmp(pcVar11,__s2);
          if (iVar5 != 0) {
            sVar7 = strlen(pcVar11);
            if (((cVar1 != '(') || (sVar7 < 3)) || (pcVar11[sVar7 - 1] != ')')) {
LAB_0013be6d:
              if ((local_50 & 1) != 0) goto LAB_0013be74;
              break;
            }
            local_88 = (char *)operator_new__(0x2000);
            puVar8 = (undefined8 *)operator_new__(0x10000);
            local_40 = sVar7;
            if (0x1ffc < sVar7) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                         ,0x79);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2e);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"len < buf.size() - 3",0x14)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"too long parameter",0x12);
              die::~die((die *)&local_78);
            }
            __s = local_88;
            strncpy(local_88,pcVar11 + 1,0x2000);
            __s[local_40 - 2] = '\0';
            sVar7 = strlen(__s);
            pcVar11 = __s + sVar7;
            uVar19 = 0;
            puVar10 = puVar8;
            do {
              pcVar2 = __s;
              if (uVar19 == 0x2000) {
                uVar19 = 0x2000;
                break;
              }
              for (; (pcVar16 = pcVar11, pcVar2 != pcVar11 && (pcVar16 = pcVar2, *pcVar2 != '|'));
                  pcVar2 = pcVar2 + 1) {
              }
              *pcVar16 = '\0';
              *puVar10 = __s;
              puVar10 = puVar10 + 1;
              uVar19 = uVar19 + 1;
              __s = pcVar16 + 1;
            } while (pcVar16 != pcVar11);
            if (0x1fff < uVar19) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                         ,0x79);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x32);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"n < col.size()",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"too long OR nodes",0x11);
              die::~die((die *)&local_78);
            }
            uVar18 = 0;
            while (iVar5 = strcmp(__s2,(char *)puVar8[uVar18]), iVar5 != 0) {
              uVar18 = uVar18 + 1;
              if (uVar19 == uVar18) {
                operator_delete__(puVar8);
                operator_delete__(local_88);
                this = local_80;
                goto LAB_0013be6d;
              }
            }
            operator_delete__(puVar8);
            operator_delete__(local_88);
            this = local_80;
          }
        }
        uVar13 = uVar13 + 1;
        pbVar6 = (this->spat_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar20 = uVar13 < (ulong)((long)(this->spat_).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >>
                                 5);
      } while (bVar20);
    }
    local_58->_M_string_length = 0;
    *(local_58->_M_dataplus)._M_p = '\0';
    pbVar6 = (this->dpat_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar20 = true;
    if ((this->dpat_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar6) {
      uVar13 = 0;
      do {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        local_50 = uVar13;
        if (0 < (long)pbVar6[uVar13]._M_string_length) {
          pbVar15 = (byte *)pbVar6[uVar13]._M_dataplus._M_p;
          pbVar12 = pbVar15 + pbVar6[uVar13]._M_string_length;
          do {
            if (*pbVar15 == 0x24) {
              pbVar14 = pbVar15 + 1;
              bVar20 = pbVar14 < pbVar12;
              if ((bVar20) && (bVar4 = *pbVar14, (byte)(bVar4 - 0x30) < 10)) {
                lVar17 = 0;
                pbVar15 = pbVar15 + 2;
                do {
                  pbVar14 = pbVar15;
                  lVar17 = (ulong)bVar4 + lVar17 * 10 + -0x30;
                  bVar20 = pbVar14 < pbVar12;
                  if (!bVar20) break;
                  bVar4 = *pbVar14;
                  pbVar15 = pbVar14 + 1;
                } while ((byte)(bVar4 - 0x30) < 10);
              }
              else {
                lVar17 = 0;
              }
              if (local_38 <= lVar17 - 1U) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                           ,0x79);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
                poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x69);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,"n > 0 && (n - 1) < size",0x17);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," out of range: [",0x10);
                pbVar6 = (local_80->dpat_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,pbVar6[uVar13]._M_dataplus._M_p,
                                    pbVar6[uVar13]._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                die::~die(&local_89);
              }
              std::__cxx11::string::append((char *)&local_78);
              pbVar15 = pbVar14;
              if (bVar20) {
                std::__cxx11::string::push_back((char)&local_78);
              }
            }
            else {
              std::__cxx11::string::push_back((char)&local_78);
            }
            pbVar15 = pbVar15 + 1;
          } while (pbVar15 < pbVar12);
        }
        bVar20 = escape_csv_element(&local_78);
        uVar13 = local_50;
        pRVar3 = local_80;
        if (!bVar20) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                     ,0x79);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x71);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"escape_csv_element(&elm)",0x18)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
          if (!bVar20) {
            die::~die(&local_8a);
          }
        }
        std::__cxx11::string::_M_append((char *)local_58,(ulong)local_78._M_dataplus._M_p);
        uVar13 = uVar13 + 1;
        if (uVar13 != (long)(pRVar3->dpat_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pRVar3->dpat_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) {
          std::__cxx11::string::append((char *)local_58);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        pbVar6 = (pRVar3->dpat_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar13 < (ulong)((long)(pRVar3->dpat_).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5
                               ));
      bVar20 = true;
    }
  }
  return bVar20;
}

Assistant:

bool RewritePattern::rewrite(size_t size,
                             const char **input,
                             std::string *output) const {
  if (spat_.size() > size) return false;
  for (size_t i = 0; i < spat_.size(); ++i) {
    if (!match_rewrite_pattern(spat_[i].c_str(), input[i]))
      return false;
  }

  output->clear();
  for (size_t i = 0; i < dpat_.size(); ++i) {
    std::string elm;
    const char *begin = dpat_[i].c_str();
    const char *end = begin + dpat_[i].size();
    for (const char *p = begin; p < end; ++p) {
      if (*p == '$') {
        ++p;
        size_t n = 0;
        for (; p < end; ++p) {
          switch (*p) {
            case '0': case '1': case '2': case '3': case '4':
            case '5': case '6': case '7': case '8': case '9':
              n = 10 * n + (*p - '0');
              break;
            default:
              goto NEXT;
          }
        }
     NEXT:
        CHECK_DIE(n > 0 && (n - 1) < size)
            << " out of range: [" << dpat_[i] << "] " << n;
        elm += input[n - 1];
        if (p < end) elm += *p;
      } else {
        elm += *p;
      }
    }
    CHECK_DIE(escape_csv_element(&elm));
    *output += elm;
    if (i + 1 != dpat_.size()) *output += ",";
  }

  return true;
}